

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ResultBuilder::handleResult(ResultBuilder *this,AssertionResult *result)

{
  char cVar1;
  int iVar2;
  IResultCapture *pIVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  Ptr<const_Catch::IConfig> local_20;
  
  pIVar3 = getResultCapture();
  (*pIVar3->_vptr_IResultCapture[2])(pIVar3,result);
  if ((((result->m_resultData).resultType & FailureBit) != Ok) &&
     (((result->m_info).resultDisposition & SuppressFail) == 0)) {
    pIVar4 = getCurrentMutableContext();
    (*(pIVar4->super_IContext)._vptr_IContext[6])(&local_20,pIVar4);
    iVar2 = (*((local_20.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[8])();
    Ptr<const_Catch::IConfig>::~Ptr(&local_20);
    if ((char)iVar2 != '\0') {
      this->m_shouldDebugBreak = true;
    }
    pIVar4 = getCurrentMutableContext();
    iVar2 = (*(pIVar4->super_IContext)._vptr_IContext[3])(pIVar4);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if ((cVar1 != '\0') || (((this->m_assertionInfo).resultDisposition & Normal) != 0)) {
      this->m_shouldThrow = true;
    }
  }
  return;
}

Assistant:

void ResultBuilder::handleResult( AssertionResult const& result )
    {
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || (m_assertionInfo.resultDisposition & ResultDisposition::Normal) )
                m_shouldThrow = true;
        }
    }